

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_gotoxy(wchar_t x,wchar_t y)

{
  term_win *ptVar1;
  errr eVar2;
  
  eVar2 = -1;
  if ((((L'\xffffffff' < x) && (x < Term->wid)) && (L'\xffffffff' < y)) && (y < Term->hgt)) {
    ptVar1 = Term->scr;
    ptVar1->cx = x;
    ptVar1->cy = y;
    ptVar1->cu = false;
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

errr Term_gotoxy(int x, int y)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Remember the cursor */
	Term->scr->cx = x;
	Term->scr->cy = y;

	/* The cursor is not useless */
	Term->scr->cu = 0;

	/* Success */
	return (0);
}